

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * append_str(char *zText,int n,int p1,int p2,int bNoSubst)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  char zInt [40];
  char local_58 [40];
  
  pcVar5 = append_str::z;
  if (zText == (char *)0x0) {
    if (append_str::z != (char *)0x0 && append_str::used == 0) {
      *append_str::z = '\0';
    }
    append_str::used = 0;
  }
  else {
    sVar2 = (size_t)(uint)n;
    if (n < 1) {
      if ((n < 0) && (append_str::used = append_str::used + n, append_str::used < 0)) {
        __assert_fail("used>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                      ,0xdc3,"char *append_str(const char *, int, int, int, int)");
      }
      sVar2 = strlen(zText);
    }
    uVar3 = (long)(int)sVar2 + (long)append_str::used + 0x50;
    if ((ulong)(long)append_str::alloced <= uVar3) {
      append_str::alloced = (int)uVar3 + 200;
      append_str::z = (char *)realloc(append_str::z,(long)append_str::alloced);
    }
    if (append_str::z == (char *)0x0) {
      pcVar5 = append_str::empty;
    }
    else {
      if (0 < (int)sVar2) {
        do {
          pcVar5 = zText + 1;
          iVar6 = (int)sVar2;
          if ((((iVar6 == 1) || (bNoSubst != 0)) || (*zText != '%')) || (*pcVar5 != 'd')) {
            uVar7 = iVar6 - 1;
            lVar4 = (long)append_str::used;
            append_str::used = append_str::used + 1;
            append_str::z[lVar4] = *zText;
          }
          else {
            sprintf(local_58,"%d",(ulong)(uint)p1);
            iVar1 = append_str::used;
            pcVar5 = append_str::z + append_str::used;
            strcpy(pcVar5,local_58);
            sVar2 = strlen(pcVar5);
            append_str::used = (int)sVar2 + iVar1;
            pcVar5 = zText + 2;
            uVar7 = iVar6 - 2;
            p1 = p2;
          }
          sVar2 = (size_t)uVar7;
          zText = pcVar5;
        } while (0 < (int)uVar7);
      }
      pcVar5 = append_str::z;
      append_str::z[append_str::used] = '\0';
    }
  }
  return pcVar5;
}

Assistant:

PRIVATE char *append_str(const char *zText, int n, int p1, int p2, int bNoSubst){
  static char empty[1] = { 0 };
  static char *z = 0;
  static int alloced = 0;
  static int used = 0;
  int c;
  char zInt[40];
  if( zText==0 ){
    if( used==0 && z!=0 ) z[0] = 0;
    used = 0;
    return z;
  }
  if( n<=0 ){
    if( n<0 ){
      used += n;
      assert( used>=0 );
    }
    n = lemonStrlen(zText);
  }
  if( n+sizeof(zInt)*2+used >= (size_t)alloced ){
    alloced = n + sizeof(zInt)*2 + used + 200;
    z = (char *) realloc(z,  alloced);
  }
  if( z==0 ) return empty;
  while( n-- > 0 ){
    c = *(zText++);
    if( !bNoSubst && c=='%' && n>0 && zText[0]=='d' ){
      sprintf(zInt, "%d", p1);
      p1 = p2;
      strcpy(&z[used], zInt);
      used += lemonStrlen(&z[used]);
      zText++;
      n--;
    }else{
      z[used++] = c;
    }
  }
  z[used] = 0;
  return z;
}